

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

double wolfe_eval<sparse_parameters>
                 (vw *all,bfgs *b,float *mem,double loss_sum,double previous_loss_sum,
                 double step_size,double importance_weight_sum,int *origin,double *wolfe1,
                 sparse_parameters *weights)

{
  undefined8 uVar1;
  __node_base *p_Var2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  p_Var2 = &(weights->_map)._M_h._M_before_begin;
  dVar3 = 0.0;
  dVar4 = 0.0;
  dVar5 = 0.0;
  dVar6 = 0.0;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    uVar1 = *(undefined8 *)
             ((long)&(*(_Hash_node_base **)
                       &((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor)->_M_nxt + 4);
    dVar7 = (double)(float)uVar1;
    dVar8 = (double)(float)((ulong)uVar1 >> 0x20);
    dVar3 = dVar3 + dVar7 * dVar7;
    dVar4 = dVar4 + dVar7 * dVar8;
    dVar5 = dVar5 + dVar7 * dVar7 *
                    (double)*(float *)((long)&(*(_Hash_node_base **)
                                                &((_Prime_rehash_policy *)(p_Var2 + 2))->
                                                 _M_max_load_factor)[1]._M_nxt + 4);
    dVar6 = dVar6 + dVar8 * (double)mem[((ulong)p_Var2[1]._M_nxt >>
                                        ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride
                                        + (long)(*origin % b->mem_stride)];
  }
  dVar7 = (loss_sum - previous_loss_sum) / (dVar6 * step_size);
  *wolfe1 = dVar7;
  if (all->quiet == false) {
    fprintf(_stderr,"%-10.5f\t%-10.5f\t%s%-10f\t%-10f\t",
            dVar3 / (importance_weight_sum * importance_weight_sum),dVar5 / importance_weight_sum,
            dVar7,dVar4 / dVar6," ");
  }
  return step_size * 0.5;
}

Assistant:

double wolfe_eval(vw& all, bfgs& b, float* mem, double loss_sum, double previous_loss_sum, double step_size,
    double importance_weight_sum, int& origin, double& wolfe1, T& weights)
{
  double g0_d = 0.;
  double g1_d = 0.;
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    g0_d += ((double)mem1[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    g1_d += ((double)(&(*w))[W_GT]) * (&(*w))[W_DIR];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * (&(*w))[W_GT] * ((&(*w))[W_COND]);
    g1_g1 += ((double)(&(*w))[W_GT]) * (&(*w))[W_GT];
  }

  wolfe1 = (loss_sum - previous_loss_sum) / (step_size * g0_d);
  double wolfe2 = g1_d / g0_d;
  // double new_step_cross = (loss_sum-previous_loss_sum-g1_d*step)/(g0_d-g1_d);

  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%s%-10f\t%-10f\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, " ", wolfe1, wolfe2);
  return 0.5 * step_size;
}